

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcConstructionResource::~IfcConstructionResource
          (IfcConstructionResource *this,void **vtt)

{
  void **vtt_local;
  IfcConstructionResource *this_local;
  
  *(void **)this = *vtt;
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)) = vtt[0x19];
  *(void **)&this->field_0x88 = vtt[0x1a];
  *(void **)&this->field_0x98 = vtt[0x1b];
  *(void **)&this->field_0xd0 = vtt[0x1c];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).
  _vptr_ObjectHelper = (_func_int **)vtt[0x1d];
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Maybe(&this->ResourceConsumption);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Maybe(&this->ResourceGroup);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).
          field_0x10);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>::~ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>,
             vtt + 0x17);
  IfcResource::~IfcResource((IfcResource *)this,vtt + 1);
  return;
}

Assistant:

IfcConstructionResource() : Object("IfcConstructionResource") {}